

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calc.cpp
# Opt level: O1

void * parse_TERM(SymbolContext<char> *ctx)

{
  int *piVar1;
  
  if ((int)ctx->symbol->end - (int)ctx->symbol->start == 1) {
    piVar1 = (int *)*ctx->values;
  }
  else {
    piVar1 = (int *)operator_new(4);
    *piVar1 = *(int *)ctx->values[1] * *(int *)*ctx->values;
  }
  return piVar1;
}

Assistant:

void *parse_TERM(const SymbolContext<char>& ctx)
{
    if (ctx.len() == 1)
        return ctx.value<Number>(1);
    else
        return new Number{ctx.value<Number>(1)->num * ctx.value<Number>(2)->num};
}